

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_conn.c
# Opt level: O3

int proxy_conn_stop(proxy_conn_handle *pc)

{
  void *pvVar1;
  uint uVar2;
  uint uVar3;
  
  pvVar1 = pc->priv;
  proxy_conn_finish(pc);
  uVar2 = worker_join((worker_handle *)((long)pvVar1 + 0xb8));
  uVar3 = worker_join((worker_handle *)((long)pvVar1 + 0x98));
  if (-1 < (int)uVar3) {
    uVar3 = uVar2 & (int)uVar2 >> 0x1f;
  }
  uVar2 = worker_join((worker_handle *)((long)pvVar1 + 0x78));
  if (-1 < (int)uVar2) {
    uVar2 = uVar3;
  }
  return uVar2;
}

Assistant:

int proxy_conn_stop(struct proxy_conn_handle *pc)
{
	struct proxy_conn_priv *priv = pc->priv;
	int ret;
	int final_ret = 0;

	proxy_conn_finish(pc);

	ret = worker_join(&priv->worker_tcp);
	if (ret < 0)
		final_ret = ret;

	ret = worker_join(&priv->worker_data);
	if (ret < 0)
		final_ret = ret;

	ret = worker_join(&priv->worker_control);
	if (ret < 0)
		final_ret = ret;

	return final_ret;
}